

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

void __thiscall
QAbstractSocketPrivate::emitBytesWritten(QAbstractSocketPrivate *this,qint64 bytes,int channel)

{
  QAbstractSocket *pQVar1;
  uint in_EDX;
  QAbstractSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractSocket *q;
  QScopedValueRollback<bool> r;
  QScopedValueRollback<bool> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  if (((in_RDI->emittedBytesWritten & 1U) == 0) && (in_EDX == *(uint *)&in_RDI->field_0xb4)) {
    local_18.varRef = (bool *)0xaaaaaaaaaaaaaaaa;
    local_18.oldValue = true;
    local_18._9_7_ = 0xaaaaaaaaaaaaaa;
    QScopedValueRollback<bool>::QScopedValueRollback(&local_18,&in_RDI->emittedBytesWritten);
    in_RDI->emittedBytesWritten = true;
    QIODevice::bytesWritten((longlong)pQVar1);
    QScopedValueRollback<bool>::~QScopedValueRollback(&local_18);
  }
  QIODevice::channelBytesWritten((int)pQVar1,(ulong)in_EDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSocketPrivate::emitBytesWritten(qint64 bytes, int channel)
{
    Q_Q(QAbstractSocket);
    // Only emit bytesWritten() when not recursing.
    if (!emittedBytesWritten && channel == currentWriteChannel) {
        QScopedValueRollback<bool> r(emittedBytesWritten);
        emittedBytesWritten = true;
        emit q->bytesWritten(bytes);
    }
    // channelBytesWritten() can be emitted recursively - even for the same channel.
    emit q->channelBytesWritten(channel, bytes);
}